

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O0

int64_t __thiscall
disruptor::YieldingStrategy<200l>::WaitFor<long,std::ratio<1l,1l>>
          (YieldingStrategy<200L> *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1L>_> *timeout)

{
  bool bVar1;
  long *in_RSI;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  function<long_()> min_sequence;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stop;
  time_point start;
  int64_t counter;
  int64_t available_sequence;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  function<long_()> *in_stack_ffffffffffffff60;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  function<long_()> *local_8;
  
  std::chrono::_V2::system_clock::now();
  std::chrono::operator+(in_RDI,(duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff60);
  buildMinSequenceFunction
            ((Sequence *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  do {
    in_stack_ffffffffffffff60 =
         (function<long_()> *)std::function<long_()>::operator()(in_stack_ffffffffffffff60);
    local_8 = in_stack_ffffffffffffff60;
    if (*in_RSI <= (long)in_stack_ffffffffffffff60) goto LAB_0012f0fc;
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)in_RDI,
                       (memory_order)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    if (bVar1) {
      local_8 = (function<long_()> *)0xfffffffffffffffe;
      goto LAB_0012f0fc;
    }
    YieldingStrategy<200L>::ApplyWaitMethod
              ((YieldingStrategy<200L> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),0x12f09e);
    std::chrono::_V2::system_clock::now();
    in_stack_ffffffffffffff5f =
         std::chrono::operator<=
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_ffffffffffffff60,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  } while (!(bool)in_stack_ffffffffffffff5f);
  local_8 = (function<long_()> *)0xfffffffffffffffd;
LAB_0012f0fc:
  std::function<long_()>::~function((function<long_()> *)0x12f106);
  return (int64_t)local_8;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<R, P>& timeout) {
    int64_t available_sequence = kInitialCursorValue;
    int64_t counter = S;

    const auto start = std::chrono::system_clock::now();
    const auto stop = start + timeout;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      counter = ApplyWaitMethod(counter);

      if (stop <= std::chrono::system_clock::now()) return kTimeoutSignal;
    }

    return available_sequence;
  }